

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O1

double __thiscall libDAI::TreeEP::run(TreeEP *this)

{
  map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
  *this_00;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *Qa;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *Qb;
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_02;
  size_type __n;
  undefined4 extraout_var_03;
  ulong uVar6;
  undefined4 extraout_var_04;
  undefined8 uVar7;
  undefined4 extraout_var_05;
  pointer pVVar8;
  mapped_type *pmVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  iterator iVar10;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  iterator iVar11;
  undefined4 extraout_var_11;
  pointer pTVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  pointer pVVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Diffs diffs;
  Factor nb;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Diffs local_c0;
  clock_t local_88;
  TFactor<double> local_80;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_48;
  
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                    ();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])
              (&local_c0,this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)local_c0.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,
                        (long)local_c0.super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"...",3);
    if ((pointer *)
        local_c0.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != &local_c0.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
      operator_delete(local_c0.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                    (this);
  if (2 < CONCAT44(extraout_var_00,iVar3)) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  local_88 = toc();
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                    (this);
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x28))
                    ((long *)CONCAT44(extraout_var_01,iVar3));
  Diffs::Diffs(&local_c0,lVar5,1.0);
  local_48.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                    (this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x28))
                  ((long *)CONCAT44(extraout_var_02,iVar3));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&local_48,__n);
  uVar14 = 0;
  while( true ) {
    iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [5])(this);
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x28))
                      ((long *)CONCAT44(extraout_var_03,iVar3));
    if (uVar6 <= uVar14) break;
    iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
              [5])(this);
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_04,iVar3),uVar14);
    (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
              (&local_80,this,uVar7);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&local_48,
               &local_80);
    if (local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar14 = uVar14 + 1;
  }
  this->_iterations = 0;
  if ((this->Props2).maxiter != 0) {
    this_00 = &this->_Q;
    Qa = &(this->super_JTree)._Qa;
    Qb = &(this->super_JTree)._Qb;
    do {
      iVar10._M_current = &local_c0._def;
      if (local_c0._maxsize <=
          (ulong)((long)local_c0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_c0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar10._M_current = local_c0._maxpos._M_current;
      }
      if (*iVar10._M_current <= (this->Props2).tol) break;
      pVVar15 = (pointer)0x0;
      while( true ) {
        local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar15;
        iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm.
                  _vptr_InferenceAlgorithm[5])(this);
        pVVar8 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x48))
                                    ((long *)CONCAT44(extraout_var_05,iVar3));
        if (pVVar8 <= pVVar15) break;
        bVar2 = offtree(this,(size_t)local_80._vs._vars.
                                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        if (bVar2) {
          pmVar9 = std::
                   map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
                   ::operator[](this_00,(key_type *)&local_80);
          TreeEPSubTree::InvertAndMultiply(pmVar9,Qa,Qb);
          pmVar9 = std::
                   map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
                   ::operator[](this_00,(key_type *)&local_80);
          TreeEPSubTree::HUGIN_with_I(pmVar9,Qa,Qb);
          pmVar9 = std::
                   map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
                   ::operator[](this_00,(key_type *)&local_80);
          TreeEPSubTree::InvertAndMultiply(pmVar9,Qa,Qb);
        }
        pVVar15 = (pointer)((long)&(local_80._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_label + 1);
      }
      uVar14 = 0;
      while( true ) {
        iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm.
                  _vptr_InferenceAlgorithm[5])(this);
        uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x28))
                          ((long *)CONCAT44(extraout_var_06,iVar3));
        if (uVar6 <= uVar14) break;
        iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm.
                  _vptr_InferenceAlgorithm[5])(this);
        uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x30))
                          ((long *)CONCAT44(extraout_var_07,iVar3),uVar14);
        (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
                  (&local_80,this,uVar7);
        dVar16 = -1.0;
        if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start) {
          pTVar12 = local_48.
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14;
          dVar16 = -1.0;
          if ((pTVar12->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar12->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            if ((long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar16 = 0.0;
            }
            else {
              lVar5 = (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3;
              auVar17 = ZEXT816(0);
              lVar13 = 0;
              auVar19._8_8_ = 0x7fffffffffffffff;
              auVar19._0_8_ = 0x7fffffffffffffff;
              do {
                auVar18._8_8_ = 0;
                auVar18._0_8_ =
                     local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13] -
                     (pTVar12->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
                auVar18 = vandpd_avx(auVar18,auVar19);
                auVar17 = vmaxsd_avx(auVar18,auVar17);
                dVar16 = auVar17._0_8_;
                lVar13 = lVar13 + 1;
              } while (lVar5 + (ulong)(lVar5 == 0) != lVar13);
            }
          }
        }
        Diffs::push(&local_c0,dVar16);
        TFactor<double>::operator=
                  (local_48.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14,&local_80);
        if (local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_80._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar14 = uVar14 + 1;
      }
      iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm
                [6])(this);
      if (2 < CONCAT44(extraout_var_08,iVar3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TreeEP::run:  maxdiff ",0x16);
        iVar10._M_current = &local_c0._def;
        if (local_c0._maxsize <=
            (ulong)((long)local_c0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_c0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
          iVar10._M_current = local_c0._maxpos._M_current;
        }
        poVar4 = std::ostream::_M_insert<double>(*iVar10._M_current);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," after ",7);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," passes",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      uVar14 = this->_iterations + 1;
      this->_iterations = uVar14;
    } while (uVar14 < (this->Props2).maxiter);
  }
  iVar10._M_current = &local_c0._def;
  iVar11._M_current = iVar10._M_current;
  if (local_c0._maxsize <=
      (ulong)((long)local_c0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar11._M_current = local_c0._maxpos._M_current;
  }
  if (this->_maxdiff < *iVar11._M_current) {
    this->_maxdiff = *iVar11._M_current;
  }
  iVar3 = (*(this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])
                    (this);
  if (CONCAT44(extraout_var_09,iVar3) != 0) {
    iVar11._M_current = iVar10._M_current;
    if (local_c0._maxsize <=
        (ulong)((long)local_c0.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_c0.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3)) {
      iVar11._M_current = local_c0._maxpos._M_current;
    }
    p_Var1 = (this->super_JTree).super_DAIAlgRG.super_InferenceAlgorithm._vptr_InferenceAlgorithm[6]
    ;
    if (*iVar11._M_current <= (this->Props2).tol) {
      iVar3 = (*p_Var1)(this);
      if (2 < CONCAT44(extraout_var_11,iVar3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TreeEP::run:  ",0xe);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"converged in ",0xd);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," passes (",9);
      toc();
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," clocks).",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      iVar3 = (*p_Var1)(this);
      if (CONCAT44(extraout_var_10,iVar3) == 1) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TreeEP::run:  WARNING: not converged within ",0x2c);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," passes (",9);
      toc();
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," clocks)...final maxdiff:",0x19);
      iVar11._M_current = iVar10._M_current;
      if (local_c0._maxsize <=
          (ulong)((long)local_c0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_c0.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar11._M_current = local_c0._maxpos._M_current;
      }
      poVar4 = std::ostream::_M_insert<double>(*iVar11._M_current);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (local_c0._maxsize <=
      (ulong)((long)local_c0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar10._M_current = local_c0._maxpos._M_current;
  }
  dVar16 = *iVar10._M_current;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_48);
  if (local_c0.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_c0.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar16;
}

Assistant:

double TreeEP::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 3)
            cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(belief(grm().var(i)));

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props2.maxiter && diffs.max() > Props2.tol; _iterations++ ) {
            for( size_t I = 0; I < grm().nrFactors(); I++ )
                if( offtree(I) ) {  
                    _Q[I].InvertAndMultiply( _Qa, _Qb );
                    _Q[I].HUGIN_with_I( _Qa, _Qb );
                    _Q[I].InvertAndMultiply( _Qa, _Qb );
                }

            // calculate new beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor nb( belief(grm().var(i)) );
                diffs.push( dist( nb, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = nb;
            }

            if( Verbose() >= 3 )
                cout << "TreeEP::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props2.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                cout << "TreeEP::run:  WARNING: not converged within " << Props2.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 3 )
                    cout << "TreeEP::run:  ";
                cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }